

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpinfo.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  FILE *__stream;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  undefined4 uVar11;
  code *pcVar12;
  optparse *poVar13;
  optparse *poVar14;
  code *pcVar15;
  byte bVar16;
  char *local_118;
  yabmp_info *l_info;
  undefined4 local_104;
  optparse optparsecpy;
  optparse optparse;
  
  __stream = _stdout;
  bVar16 = 0;
  pcVar5 = yabmp_basename(*argv);
  *argv = pcVar5;
  optparse_init(&optparse,argv);
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  local_118 = (char *)0x0;
  while (iVar4 = optparse_long(&optparse,main::options,(int *)0x0), iVar4 != -1) {
    if (iVar4 == 0x68) {
      bVar3 = false;
      bVar1 = true;
    }
    else if (iVar4 == 0x6f) {
      local_118 = optparse.optarg;
    }
    else if (iVar4 == 0x71) {
      bVar3 = true;
    }
    else if (iVar4 == 0x76) {
      bVar2 = true;
      bVar3 = false;
    }
    else if (iVar4 == 0x3f) {
      bVar1 = false;
      fprintf(_stderr,"%s: %s\n",*argv,optparse.errmsg);
      print_usage((FILE *)_stderr,*argv);
      iVar4 = 1;
LAB_001025fc:
      pcVar5 = local_118;
      uVar11 = 0;
LAB_00102603:
      if (((__stream != (FILE *)0x0) && (__stream != _stdout)) &&
         (fclose(__stream), !bVar1 && (char)uVar11 == '\0')) {
        remove(pcVar5);
      }
      return iVar4;
    }
  }
  pcVar5 = (char *)0x0;
  if (!bVar1) {
    pcVar5 = local_118;
  }
  if ((pcVar5 != (char *)0x0) &&
     (((*pcVar5 != '-' || (pcVar5[1] != '\0')) &&
      (__stream = fopen(pcVar5,"wt"), __stream == (FILE *)0x0)))) {
    iVar4 = 1;
    if (!bVar3) {
      fprintf(_stderr,"Can\'t open file %s for writing\n",pcVar5);
    }
    bVar1 = false;
    __stream = (FILE *)0x0;
    pcVar5 = local_118;
    uVar11 = 0;
    goto LAB_00102603;
  }
  if (bVar2) {
    pcVar7 = *argv;
    uVar6 = yabmp_get_version_string();
    fprintf(__stream,"%s %s\n",pcVar7,uVar6);
  }
  if (bVar1) {
    print_usage((FILE *)_stdout,*argv);
    iVar4 = 0;
    bVar1 = true;
    pcVar5 = (char *)0x0;
    uVar11 = 0;
    goto LAB_00102603;
  }
  pcVar7 = optparse_arg(&optparse);
  if (pcVar7 == (char *)0x0) {
    if (bVar2) {
      iVar4 = 0;
      bVar1 = true;
    }
    else {
      iVar4 = 1;
      if (bVar3) {
        bVar1 = false;
      }
      else {
        bVar1 = false;
        fprintf(_stderr,"%s: missing file1 argument\n",*argv);
        print_usage((FILE *)_stderr,*argv);
      }
    }
    goto LAB_001025fc;
  }
  poVar13 = &optparse;
  poVar14 = &optparsecpy;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    poVar14->argv = poVar13->argv;
    poVar13 = (optparse *)((long)poVar13 + (ulong)bVar16 * -0x10 + 8);
    poVar14 = (optparse *)((long)poVar14 + (ulong)bVar16 * -0x10 + 8);
  }
  pcVar8 = optparse_arg(&optparsecpy);
  local_104 = (undefined4)CONCAT71((int7)((ulong)pcVar8 >> 8),pcVar8 != (char *)0x0);
  pcVar12 = print_error;
  if (bVar3) {
    pcVar12 = (code *)0x0;
  }
  pcVar15 = print_warning;
  if (bVar3) {
    pcVar15 = (code *)0x0;
  }
  pcVar9 = (char *)0x0;
  while( true ) {
    optparsecpy.argv = (char **)0x0;
    l_info = (yabmp_info *)0x0;
    if (pcVar8 != (char *)0x0) {
      if (pcVar9 != (char *)0x0) {
        fputc(10,__stream);
      }
      pcVar9 = yabmp_basename(pcVar7);
      fprintf(__stream,"%s:\n",pcVar9);
      pcVar9 = pcVar7;
    }
    iVar4 = yabmp_create_reader(&optparsecpy,0,pcVar12,pcVar15,0,0,0);
    if ((iVar4 != 0) || (iVar4 = yabmp_create_info(optparsecpy.argv,&l_info), iVar4 != 0)) break;
    if ((*pcVar7 == '-') && (pcVar7[1] == '\0')) {
      yabmp_set_input_stream(optparsecpy.argv,_stdin,yabmp_file_read,0);
    }
    else {
      iVar4 = yabmp_set_input_file(optparsecpy.argv,pcVar7);
      if (iVar4 != 0) break;
    }
    iVar4 = yabmp_read_info(optparsecpy.argv,l_info);
    if (iVar4 != 0) break;
    yabmp_printinfo((FILE *)__stream,(yabmp *)optparsecpy.argv,l_info);
    yabmp_destroy_reader(&optparsecpy);
    pcVar7 = optparse_arg(&optparse);
    if (pcVar7 == (char *)0x0) {
      iVar4 = 0;
      bVar1 = true;
      uVar11 = local_104;
      goto LAB_00102603;
    }
  }
  yabmp_destroy_reader(&optparsecpy,&l_info);
  iVar4 = 1;
  bVar1 = false;
  uVar11 = local_104;
  goto LAB_00102603;
}

Assistant:

int main(int argc, char* argv[])
{
	static const struct optparse_long options[] = {
		{ "version", 'v', OPTPARSE_NONE },
		{ "help",    'h', OPTPARSE_NONE },
		{ "quiet",   'q', OPTPARSE_NONE },
		{ "output",  'o', OPTPARSE_REQUIRED },
		{ 0 }
	};
	int result = EXIT_SUCCESS;
	int has_multiple_files = 0;
	struct optparse optparse;
	int option;
	struct {
		unsigned int version:1;
		unsigned int help:1;
		unsigned int quiet:1;
	} flags = {0};
	const char* output = NULL;
	const char* input = NULL;
	const char* last_input = NULL;
	FILE* outStream = stdout;
	
	argv[0] = (char*)yabmp_basename(argv[0]);
	
	optparse_init(&optparse, argv);
	
	while ((option = optparse_long(&optparse, options, NULL)) != -1) {
		switch (option) {
			case 'v':
				flags.version = 1;
				break;
			case 'h':
				flags.help = 1;
				break;
			case 'q':
				flags.quiet = 1;
				break;
			case 'o':
				output = optparse.optarg;
				break;
			case '?':
				fprintf(stderr, "%s: %s\n", argv[0], optparse.errmsg);
				print_usage(stderr, argv[0]);
				result = 1;
				goto BADEND;
		}
	}
	
	if (flags.help) {
		output = NULL;
	}
	
	if ((output != NULL) && (strcmp(output, "-") != 0)) {
		outStream = fopen(output, "wt");
		if (outStream == NULL) {
			if (!flags.quiet) {
				fprintf(stderr, "Can't open file %s for writing\n", output);
			}
			result = 1;
			goto BADEND;
		}
	}
	
	if (flags.version) {
		fprintf(outStream, "%s %s\n", argv[0], yabmp_get_version_string());
	}
	if (flags.help) {
		print_usage(stdout, argv[0]);
		goto BADEND;
	}
	
	input = optparse_arg(&optparse);
	if (input == NULL) {
		if (!flags.version) {
			if (!flags.quiet) {
				fprintf(stderr, "%s: missing file1 argument\n", argv[0]);
				print_usage(stderr, argv[0]);
			}
			result = 1;
		}
		goto BADEND;
	}
	
	/* Check for multiple files */
	{
		struct optparse optparsecpy;
		memcpy(&optparsecpy, &optparse, sizeof(optparse));
		if (optparse_arg(&optparsecpy) != NULL) {
			has_multiple_files = 1;
		}
	}
	
	do
	{
		yabmp* l_reader = NULL;
		yabmp_info* l_info = NULL;
		
		if (has_multiple_files) {
			if (last_input != NULL) {
				fputc('\n', outStream);
			}
			last_input = input;
			fprintf(outStream, "%s:\n", yabmp_basename(input));
		}
		if (yabmp_create_reader(&l_reader, NULL, flags.quiet ? NULL : print_error, flags.quiet ? NULL : print_warning, NULL, NULL, NULL) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if (yabmp_create_info(l_reader, &l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if ((input[0] == '-') && (input[1] == '\0')) {
			stream_setmode_binary(stdin, flags.quiet);
			/* This can't fail with proper arguments */
			(void)yabmp_set_input_stream(l_reader, stdin, yabmp_file_read, NULL, NULL);
		} else {
			if (yabmp_set_input_file(l_reader, input) != YABMP_OK) {
				result = 1;
				goto FREE_INSTANCE;
			}
		}
		if (yabmp_read_info(l_reader, l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		yabmp_printinfo(outStream, l_reader, l_info);
FREE_INSTANCE:
		yabmp_destroy_reader(&l_reader, &l_info);
		if (result) {
			goto BADEND;
		}
	} while ((input = optparse_arg(&optparse)) != NULL);
BADEND:
	if ((outStream != stdout) && (outStream != NULL)) {
		fclose(outStream);
		if (result && !has_multiple_files) {
			(void)remove(output);
		}
	}
	
	return result;
}